

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

bool __thiscall ON_XMLNode::MergeFrom(ON_XMLNode *this,ON_XMLNode *src)

{
  ON_XMLNodePrivate *pOVar1;
  ON_XMLNode *src_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ON_XMLProperty *pOVar5;
  undefined4 extraout_var_00;
  wchar_t *pwVar6;
  long *plVar7;
  ON_XMLNode *this_00;
  recursive_mutex *__mutex;
  recursive_mutex *__mutex_00;
  ChildIterator ci;
  PropertyIterator pi;
  ChildIterator local_50;
  PropertyIterator local_40;
  undefined4 extraout_var_01;
  
  __mutex = &this->_private->m_mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  __mutex_00 = &src->_private->m_mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
  if (iVar3 == 0) {
    pOVar1 = this->_private;
    iVar3 = (*src->_vptr_ON_XMLNode[3])(src);
    bVar2 = ::operator!=(&pOVar1->m_name,(ON_wString *)CONCAT44(extraout_var,iVar3));
    if (!bVar2) {
      (*src->_vptr_ON_XMLNode[0x2d])(&local_40,src,0);
      while( true ) {
        if ((local_40._private)->m_bSorted == true) {
          pOVar5 = ON_XMLNodePropertyIteratorPrivate::GetNextPropertySorted(local_40._private);
        }
        else {
          pOVar5 = (local_40._private)->m_pCurrent;
          if (pOVar5 != (ON_XMLProperty *)0x0) {
            (local_40._private)->m_pCurrent = pOVar5->_private->_next;
          }
        }
        if (pOVar5 == (ON_XMLProperty *)0x0) break;
        (*this->_vptr_ON_XMLNode[0xd])(this,pOVar5);
      }
      iVar3 = (*this->_vptr_ON_XMLNode[0x22])(this);
      (*src->_vptr_ON_XMLNode[0x2c])(&local_50,src);
      while( true ) {
        src_00 = (local_50._private)->_current;
        if (src_00 == (ON_XMLNode *)0x0) break;
        (local_50._private)->_current = src_00->_private->m_next_sibling;
        if (iVar3 == 0) {
          plVar7 = (long *)0x0;
        }
        else {
          iVar4 = (*src_00->_vptr_ON_XMLNode[3])(src_00);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_
                             ((ON_wString *)CONCAT44(extraout_var_00,iVar4));
          iVar4 = (*this->_vptr_ON_XMLNode[0x29])(this,pwVar6);
          plVar7 = (long *)CONCAT44(extraout_var_01,iVar4);
        }
        if (plVar7 == (long *)0x0) {
          this_00 = (ON_XMLNode *)operator_new(0xe8);
          ON_XMLNode(this_00,src_00);
          (*this->_vptr_ON_XMLNode[0xb])(this,this_00);
        }
        else {
          (**(code **)(*plVar7 + 0x10))(plVar7,src_00);
        }
      }
      ChildIterator::~ChildIterator(&local_50);
      PropertyIterator::~PropertyIterator(&local_40);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return !bVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool ON_XMLNode::MergeFrom(const ON_XMLNode& src)
{
  std::lock_guard<std::recursive_mutex> lg1(_private->m_mutex);
  std::lock_guard<std::recursive_mutex> lg2(src._private->m_mutex);

  if (_private->m_name != src.TagName())
    return false;

  // Copy in the parameters.
  ON_XMLProperty* pProperty = nullptr;

  auto pi = src.GetPropertyIterator();
  while (nullptr != (pProperty = pi.GetNextProperty()))
  {
    // Replaces any that are already there.
    SetProperty(*pProperty);
  }

  // Copy in the children.
  const auto bNeedToMerge = ChildCount() != 0;

  ON_XMLNode* pChild = nullptr;
  auto ci = src.GetChildIterator();
  while (nullptr != (pChild = ci.GetNextChild()))
  {
    auto* pLocalChildNode = bNeedToMerge ? GetNodeAtPath(pChild->TagName()) : nullptr;
    if (nullptr != pLocalChildNode)
    {
      pLocalChildNode->MergeFrom(*pChild);
    }
    else
    {
      AttachChildNode(new ON_XMLNode(*pChild));
    }
  }

  return true;
}